

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O3

void __thiscall
efsw::DirWatcherGeneric::handleAction
          (DirWatcherGeneric *this,string *filename,unsigned_long action,string *oldFilename)

{
  WatchID WVar1;
  FileWatchListener *pFVar2;
  pointer pcVar3;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  WVar1 = (this->Watch->super_Watcher).ID;
  pFVar2 = (this->Watch->super_Watcher).Listener;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar3 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,pcVar3 + filename->_M_string_length);
  FileSystem::fileNameFromPath(&local_50,&local_90);
  pcVar3 = (oldFilename->_M_dataplus)._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar3,pcVar3 + oldFilename->_M_string_length);
  (*pFVar2->_vptr_FileWatchListener[2])
            (pFVar2,WVar1,&this->DirSnap,&local_50,action & 0xffffffff,local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DirWatcherGeneric::handleAction( const std::string &filename, unsigned long action, std::string oldFilename)
{
	Watch->Listener->handleFileAction( Watch->ID, DirSnap.DirectoryInfo.Filepath, FileSystem::fileNameFromPath( filename ), (Action)action, oldFilename );
}